

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall
glslang::HlslGrammar::acceptType(HlslGrammar *this,TType *type,TIntermNode **nodeList)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  EHlslTokenClass EVar4;
  char *__s;
  TSymbol *pTVar5;
  TBasicType vs;
  TBasicType TVar6;
  EShMessages EVar7;
  TBasicType t;
  TBasicType TVar8;
  HlslGrammar *this_00;
  int vs_00;
  int mc;
  int iVar9;
  pool_allocator<char> local_60;
  TString name;
  
  EVar7 = (this->parseContext->super_TParseContextBase).super_TParseVersions.messages &
          EShMsgHlslEnable16BitTypes;
  if (this->typeIdentifiers == true) {
    this_00 = this;
    EVar4 = HlslTokenStream::peek(&this->super_HlslTokenStream);
    __s = getTypeString(this_00,EVar4);
    if (__s != (char *)0x0) {
      local_60.allocator = GetThreadPoolAllocator();
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      basic_string<glslang::std::allocator<char>>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&name,
                 __s,&local_60);
      pTVar5 = TSymbolTable::find((this->parseContext->super_TParseContextBase).symbolTable,&name,
                                  (bool *)0x0,(bool *)0x0,(int *)0x0);
      if (pTVar5 != (TSymbol *)0x0) {
        return false;
      }
    }
  }
  EVar4 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  bVar2 = 0;
  if (EVar4 == EHTokUnorm) {
    bVar1 = bVar2;
    bVar2 = 1;
LAB_003a77de:
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  }
  else {
    bVar1 = 0;
    if (EVar4 == EHTokSNorm) {
      bVar1 = 1;
      bVar2 = 0;
      goto LAB_003a77de;
    }
  }
  EVar4 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  bVar3 = false;
  if (0x11b < EVar4 - EHTokPointStream) {
    return false;
  }
  t = (EVar7 >> 10) + EbtFloat;
  TVar8 = (uint)(EVar7 == EShMsgDefault) * 2 + EbtInt16;
  TVar6 = (uint)(EVar7 == EShMsgDefault) * 2 + EbtUint16;
  switch(EVar4) {
  case EHTokPointStream:
  case EHTokLineStream:
  case EHTokTriangleStream:
    bVar3 = acceptStreamOutTemplateType(this,type,(TLayoutGeometry *)&name);
    if (!bVar3) {
      return false;
    }
    bVar3 = HlslParseContext::handleOutputGeometry
                      (this->parseContext,&(this->super_HlslTokenStream).token.loc,
                       (TLayoutGeometry *)&name);
    return bVar3;
  case EHTokInputPatch:
  case EHTokOutputPatch:
    bVar3 = acceptTessellationPatchTemplateType(this,type);
    return bVar3;
  default:
    bVar3 = acceptTextureType(this,type);
    return bVar3;
  case EHTokVector:
    bVar3 = acceptVectorTemplateType(this,type);
    return bVar3;
  case EHTokMatrix:
    bVar3 = acceptMatrixTemplateType(this,type);
    return bVar3;
  case EHTokVoid:
    vs = EbtFloat;
    t = EbtVoid;
    goto LAB_003a8535;
  case EHTokString:
    t = EbtString;
    goto LAB_003a851e;
  case EHTokBool:
    t = EbtBool;
    goto LAB_003a851e;
  case EHTokInt:
  case EHTokDword:
    t = EbtInt;
    goto LAB_003a851e;
  case EHTokUint:
    t = EbtUint;
    goto LAB_003a851e;
  case EHTokUint64:
    t = EbtUint64;
    goto LAB_003a851e;
  case EHTokHalf:
    vs = EbtFloat;
    goto LAB_003a8535;
  case EHTokFloat:
    vs = EbtFloat;
    t = vs;
    goto LAB_003a8535;
  case EHTokDouble:
    t = EbtDouble;
LAB_003a851e:
    vs = EbtFloat;
    goto LAB_003a8535;
  case EHTokMin16float:
  case EHTokMin10float:
    vs_00 = 1;
    goto LAB_003a82aa;
  case EHTokMin16int:
  case EHTokMin12int:
    vs_00 = 1;
    t = TVar8;
    goto LAB_003a82aa;
  case EHTokMin16uint:
    vs_00 = 1;
    t = TVar6;
    goto LAB_003a82aa;
  case EHTokBool1:
    t = EbtBool;
    goto LAB_003a80d2;
  case EHTokBool2:
    t = EbtBool;
    goto LAB_003a8529;
  case EHTokBool3:
    t = EbtBool;
    goto LAB_003a8315;
  case EHTokBool4:
    t = EbtBool;
    goto LAB_003a8442;
  case EHTokFloat1:
    t = EbtFloat;
    goto LAB_003a80d2;
  case EHTokFloat2:
    t = EbtFloat;
    goto LAB_003a8529;
  case EHTokFloat3:
    t = EbtFloat;
    goto LAB_003a8315;
  case EHTokFloat4:
    t = EbtFloat;
    goto LAB_003a8442;
  case EHTokInt1:
    t = EbtInt;
    goto LAB_003a80d2;
  case EHTokInt2:
    t = EbtInt;
    goto LAB_003a8529;
  case EHTokInt3:
    t = EbtInt;
    goto LAB_003a8315;
  case EHTokInt4:
    t = EbtInt;
    goto LAB_003a8442;
  case EHTokDouble1:
    t = EbtDouble;
    goto LAB_003a80d2;
  case EHTokDouble2:
    vs = EbtDouble;
    t = vs;
    goto LAB_003a8535;
  case EHTokDouble3:
    t = EbtDouble;
    goto LAB_003a8315;
  case EHTokDouble4:
    t = EbtDouble;
    goto LAB_003a8442;
  case EHTokUint1:
    t = EbtUint;
    goto LAB_003a80d2;
  case EHTokUint2:
    t = EbtUint;
LAB_003a8529:
    vs = EbtDouble;
    goto LAB_003a8535;
  case EHTokUint3:
    t = EbtUint;
LAB_003a8315:
    vs = EbtFloat16;
    goto LAB_003a8535;
  case EHTokUint4:
    t = EbtUint;
LAB_003a8442:
    vs = EbtInt8;
    goto LAB_003a8535;
  case EHTokHalf1:
LAB_003a80d2:
    TType::TType(type,t,EvqTemporary,1,0,0,false);
LAB_003a80df:
    type->field_0xa = type->field_0xa | 0x10;
    goto LAB_003a8542;
  case EHTokHalf2:
    vs = EbtDouble;
    goto LAB_003a8535;
  case EHTokHalf3:
    vs = EbtFloat16;
    goto LAB_003a8535;
  case EHTokHalf4:
    vs = EbtInt8;
LAB_003a8535:
    TVar6 = EbtVoid;
    TVar8 = EbtVoid;
LAB_003a853d:
    TType::TType(type,t,EvqTemporary,vs,TVar6,TVar8,false);
    goto LAB_003a8542;
  case EHTokMin16float1:
  case EHTokMin10float1:
    goto LAB_003a7c97;
  case EHTokMin16float2:
  case EHTokMin10float2:
    goto LAB_003a82a5;
  case EHTokMin16float3:
  case EHTokMin10float3:
    vs_00 = 3;
    goto LAB_003a82aa;
  case EHTokMin16float4:
  case EHTokMin10float4:
    vs_00 = 4;
    goto LAB_003a82aa;
  case EHTokMin16int1:
  case EHTokMin12int1:
    t = TVar8;
    goto LAB_003a7c97;
  case EHTokMin16int2:
  case EHTokMin12int2:
    t = TVar8;
    goto LAB_003a82a5;
  case EHTokMin16int3:
  case EHTokMin12int3:
    vs_00 = 3;
    t = TVar8;
    goto LAB_003a82aa;
  case EHTokMin16int4:
  case EHTokMin12int4:
    vs_00 = 4;
    t = TVar8;
    goto LAB_003a82aa;
  case EHTokMin16uint1:
    t = TVar6;
LAB_003a7c97:
    TType::TType(type,t,EvqTemporary,EpqMedium,1,0,0,false);
    goto LAB_003a80df;
  case EHTokMin16uint2:
    t = TVar6;
LAB_003a82a5:
    vs_00 = 2;
    goto LAB_003a82aa;
  case EHTokMin16uint3:
    vs_00 = 3;
    t = TVar6;
    goto LAB_003a82aa;
  case EHTokMin16uint4:
    vs_00 = 4;
    t = TVar6;
LAB_003a82aa:
    iVar9 = 0;
    mc = 0;
    goto LAB_003a82ad;
  case EHTokInt1x1:
    t = EbtInt;
    goto LAB_003a8502;
  case EHTokInt1x2:
    t = EbtInt;
    goto LAB_003a814f;
  case EHTokInt1x3:
    t = EbtInt;
    goto LAB_003a8450;
  case EHTokInt1x4:
    t = EbtInt;
    goto LAB_003a836c;
  case EHTokInt2x1:
    t = EbtInt;
    goto LAB_003a8173;
  case EHTokInt2x2:
    t = EbtInt;
    goto LAB_003a84e4;
  case EHTokInt2x3:
    t = EbtInt;
    goto LAB_003a84a9;
  case EHTokInt2x4:
    t = EbtInt;
    goto LAB_003a83de;
  case EHTokInt3x1:
    t = EbtInt;
    goto LAB_003a82e5;
  case EHTokInt3x2:
    t = EbtInt;
    goto LAB_003a8466;
  case EHTokInt3x3:
    t = EbtInt;
    goto LAB_003a837f;
  case EHTokInt3x4:
    t = EbtInt;
    goto LAB_003a8361;
  case EHTokInt4x1:
    t = EbtInt;
    goto LAB_003a8141;
  case EHTokInt4x2:
    t = EbtInt;
    goto LAB_003a83ba;
  case EHTokInt4x3:
    t = EbtInt;
    goto LAB_003a8266;
  case EHTokInt4x4:
    t = EbtInt;
    goto LAB_003a8353;
  case EHTokUint1x1:
    t = EbtUint;
    goto LAB_003a8502;
  case EHTokUint1x2:
    t = EbtUint;
    goto LAB_003a814f;
  case EHTokUint1x3:
    t = EbtUint;
    goto LAB_003a8450;
  case EHTokUint1x4:
    t = EbtUint;
    goto LAB_003a836c;
  case EHTokUint2x1:
    t = EbtUint;
    goto LAB_003a8173;
  case EHTokUint2x2:
    t = EbtUint;
    goto LAB_003a84e4;
  case EHTokUint2x3:
    t = EbtUint;
    goto LAB_003a84a9;
  case EHTokUint2x4:
    t = EbtUint;
    goto LAB_003a83de;
  case EHTokUint3x1:
    t = EbtUint;
    goto LAB_003a82e5;
  case EHTokUint3x2:
    t = EbtUint;
    goto LAB_003a8466;
  case EHTokUint3x3:
    t = EbtUint;
    goto LAB_003a837f;
  case EHTokUint3x4:
    t = EbtUint;
    goto LAB_003a8361;
  case EHTokUint4x1:
    t = EbtUint;
    goto LAB_003a8141;
  case EHTokUint4x2:
    t = EbtUint;
    goto LAB_003a83ba;
  case EHTokUint4x3:
    t = EbtUint;
    goto LAB_003a8266;
  case EHTokUint4x4:
    t = EbtUint;
    goto LAB_003a8353;
  case EHTokBool1x1:
    t = EbtBool;
    goto LAB_003a8502;
  case EHTokBool1x2:
    t = EbtBool;
LAB_003a814f:
    TVar6 = EbtFloat;
    goto LAB_003a8469;
  case EHTokBool1x3:
    t = EbtBool;
    goto LAB_003a8450;
  case EHTokBool1x4:
    t = EbtBool;
    goto LAB_003a836c;
  case EHTokBool2x1:
    t = EbtBool;
LAB_003a8173:
    TVar6 = EbtDouble;
    goto LAB_003a82e8;
  case EHTokBool2x2:
    t = EbtBool;
    goto LAB_003a84e4;
  case EHTokBool2x3:
    t = EbtBool;
    goto LAB_003a84a9;
  case EHTokBool2x4:
    t = EbtBool;
    goto LAB_003a83de;
  case EHTokBool3x1:
    t = EbtBool;
    goto LAB_003a82e5;
  case EHTokBool3x2:
    t = EbtBool;
    goto LAB_003a8466;
  case EHTokBool3x3:
    t = EbtBool;
    goto LAB_003a837f;
  case EHTokBool3x4:
    t = EbtBool;
    goto LAB_003a8361;
  case EHTokBool4x1:
    t = EbtBool;
    goto LAB_003a8141;
  case EHTokBool4x2:
    t = EbtBool;
    goto LAB_003a83ba;
  case EHTokBool4x3:
    t = EbtBool;
    goto LAB_003a8266;
  case EHTokBool4x4:
    t = EbtBool;
    goto LAB_003a8353;
  case EHTokFloat1x1:
    TVar6 = EbtFloat;
    t = TVar6;
    goto LAB_003a849b;
  case EHTokFloat1x2:
    t = EbtFloat;
    TVar8 = EbtDouble;
    goto LAB_003a840e;
  case EHTokFloat1x3:
    t = EbtFloat;
    goto LAB_003a840b;
  case EHTokFloat1x4:
    t = EbtFloat;
    goto LAB_003a8323;
  case EHTokFloat2x1:
    TVar6 = EbtDouble;
    goto LAB_003a848a;
  case EHTokFloat2x2:
    t = EbtFloat;
LAB_003a84e4:
    TVar6 = EbtDouble;
    goto LAB_003a850f;
  case EHTokFloat2x3:
    t = EbtFloat;
LAB_003a84a9:
    TVar6 = EbtDouble;
    goto LAB_003a84ac;
  case EHTokFloat2x4:
    t = EbtFloat;
LAB_003a83de:
    TVar6 = EbtDouble;
    goto LAB_003a83e1;
  case EHTokFloat3x1:
    TVar6 = EbtFloat16;
    goto LAB_003a848a;
  case EHTokFloat3x2:
    t = EbtFloat;
LAB_003a8466:
    TVar6 = EbtFloat16;
LAB_003a8469:
    TVar8 = EbtDouble;
    goto LAB_003a84ba;
  case EHTokFloat3x3:
    t = EbtFloat;
    goto LAB_003a837f;
  case EHTokFloat3x4:
    t = EbtFloat;
    goto LAB_003a8361;
  case EHTokFloat4x1:
    TVar6 = EbtInt8;
LAB_003a848a:
    t = EbtFloat;
LAB_003a849b:
    vs = EbtVoid;
    TVar8 = t;
    goto LAB_003a853d;
  case EHTokFloat4x2:
    t = EbtFloat;
LAB_003a83ba:
    TVar6 = EbtInt8;
    goto LAB_003a8469;
  case EHTokFloat4x3:
    t = EbtFloat;
    goto LAB_003a8266;
  case EHTokFloat4x4:
    t = EbtFloat;
    goto LAB_003a8353;
  case EHTokHalf1x1:
    TVar6 = EbtFloat;
    goto LAB_003a850f;
  case EHTokHalf1x2:
    TVar6 = EbtFloat;
    goto LAB_003a7f23;
  case EHTokHalf1x3:
    TVar6 = EbtFloat;
    goto LAB_003a8218;
  case EHTokHalf1x4:
    TVar6 = EbtFloat;
    goto LAB_003a82cb;
  case EHTokHalf2x1:
    TVar6 = EbtDouble;
    goto LAB_003a842a;
  case EHTokHalf2x2:
    TVar6 = EbtDouble;
    goto LAB_003a850f;
  case EHTokHalf2x3:
    TVar6 = EbtDouble;
    goto LAB_003a8218;
  case EHTokHalf2x4:
    TVar6 = EbtDouble;
    goto LAB_003a82cb;
  case EHTokHalf3x1:
    TVar6 = EbtFloat16;
    goto LAB_003a842a;
  case EHTokHalf3x2:
    TVar6 = EbtFloat16;
    goto LAB_003a7f23;
  case EHTokHalf3x3:
    TVar6 = EbtFloat16;
    goto LAB_003a850f;
  case EHTokHalf3x4:
    TVar6 = EbtFloat16;
LAB_003a82cb:
    TVar8 = EbtInt8;
    goto LAB_003a84ba;
  case EHTokHalf4x1:
    TVar6 = EbtInt8;
LAB_003a842a:
    TVar8 = EbtFloat;
    goto LAB_003a84ba;
  case EHTokHalf4x2:
    TVar6 = EbtInt8;
LAB_003a7f23:
    TVar8 = EbtDouble;
    goto LAB_003a84ba;
  case EHTokHalf4x3:
    TVar6 = EbtInt8;
LAB_003a8218:
    TVar8 = EbtFloat16;
    goto LAB_003a84ba;
  case EHTokHalf4x4:
    TVar6 = EbtInt8;
    goto LAB_003a850f;
  case EHTokDouble1x1:
    t = EbtDouble;
LAB_003a8502:
    TVar6 = EbtFloat;
    goto LAB_003a850f;
  case EHTokDouble1x2:
    TVar6 = EbtFloat;
    goto LAB_003a8344;
  case EHTokDouble1x3:
    t = EbtDouble;
LAB_003a8450:
    TVar6 = EbtFloat;
    goto LAB_003a84ac;
  case EHTokDouble1x4:
    t = EbtDouble;
LAB_003a836c:
    TVar6 = EbtFloat;
    goto LAB_003a83e1;
  case EHTokDouble2x1:
    t = EbtDouble;
    TVar8 = EbtFloat;
    goto LAB_003a840e;
  case EHTokDouble2x2:
    TVar6 = EbtDouble;
    t = TVar6;
    goto LAB_003a849b;
  case EHTokDouble2x3:
    t = EbtDouble;
LAB_003a840b:
    TVar8 = EbtFloat16;
    goto LAB_003a840e;
  case EHTokDouble2x4:
    t = EbtDouble;
LAB_003a8323:
    TVar8 = EbtInt8;
LAB_003a840e:
    vs = EbtVoid;
    TVar6 = t;
    goto LAB_003a853d;
  case EHTokDouble3x1:
    t = EbtDouble;
LAB_003a82e5:
    TVar6 = EbtFloat16;
LAB_003a82e8:
    TVar8 = EbtFloat;
    goto LAB_003a84ba;
  case EHTokDouble3x2:
    TVar6 = EbtFloat16;
    goto LAB_003a8344;
  case EHTokDouble3x3:
    t = EbtDouble;
LAB_003a837f:
    TVar6 = EbtFloat16;
    goto LAB_003a850f;
  case EHTokDouble3x4:
    t = EbtDouble;
LAB_003a8361:
    TVar6 = EbtFloat16;
LAB_003a83e1:
    TVar8 = EbtInt8;
LAB_003a84ba:
    vs = EbtVoid;
    goto LAB_003a853d;
  case EHTokDouble4x1:
    t = EbtDouble;
LAB_003a8141:
    TVar6 = EbtInt8;
    goto LAB_003a82e8;
  case EHTokDouble4x2:
    TVar6 = EbtInt8;
LAB_003a8344:
    t = EbtDouble;
    goto LAB_003a849b;
  case EHTokDouble4x3:
    t = EbtDouble;
LAB_003a8266:
    TVar6 = EbtInt8;
LAB_003a84ac:
    TVar8 = EbtFloat16;
    goto LAB_003a84ba;
  case EHTokDouble4x4:
    t = EbtDouble;
LAB_003a8353:
    TVar6 = EbtInt8;
LAB_003a850f:
    vs = EbtVoid;
    TVar8 = TVar6;
    goto LAB_003a853d;
  case EHTokMin16float1x1:
  case EHTokMin10float1x1:
    iVar9 = 1;
    goto LAB_003a7bb4;
  case EHTokMin16float1x2:
  case EHTokMin10float1x2:
    iVar9 = 2;
    goto LAB_003a7bb4;
  case EHTokMin16float1x3:
  case EHTokMin10float1x3:
    iVar9 = 3;
    goto LAB_003a7bb4;
  case EHTokMin16float1x4:
  case EHTokMin10float1x4:
    iVar9 = 4;
LAB_003a7bb4:
    mc = 1;
LAB_003a81c1:
    vs_00 = 0;
    goto LAB_003a82ad;
  case EHTokMin16float2x1:
  case EHTokMin10float2x1:
    iVar9 = 1;
    break;
  case EHTokMin16float2x2:
  case EHTokMin10float2x2:
    iVar9 = 2;
    break;
  case EHTokMin16float2x3:
  case EHTokMin10float2x3:
    iVar9 = 3;
    break;
  case EHTokMin16float2x4:
  case EHTokMin10float2x4:
    iVar9 = 4;
    break;
  case EHTokMin16float3x1:
  case EHTokMin10float3x1:
    iVar9 = 1;
    goto LAB_003a7ba1;
  case EHTokMin16float3x2:
  case EHTokMin10float3x2:
    iVar9 = 2;
    goto LAB_003a7ba1;
  case EHTokMin16float3x3:
  case EHTokMin10float3x3:
    iVar9 = 3;
    goto LAB_003a7ba1;
  case EHTokMin16float3x4:
  case EHTokMin10float3x4:
    iVar9 = 4;
LAB_003a7ba1:
    mc = 3;
    goto LAB_003a81c1;
  case EHTokMin16float4x1:
  case EHTokMin10float4x1:
    iVar9 = 1;
    goto LAB_003a7a8c;
  case EHTokMin16float4x2:
  case EHTokMin10float4x2:
    iVar9 = 2;
    goto LAB_003a7a8c;
  case EHTokMin16float4x3:
  case EHTokMin10float4x3:
    iVar9 = 3;
    goto LAB_003a7a8c;
  case EHTokMin16float4x4:
  case EHTokMin10float4x4:
    iVar9 = 4;
LAB_003a7a8c:
    mc = 4;
    goto LAB_003a81c1;
  case EHTokMin16int1x1:
  case EHTokMin12int1x1:
    iVar9 = 1;
    goto LAB_003a7b60;
  case EHTokMin16int1x2:
  case EHTokMin12int1x2:
    iVar9 = 2;
    goto LAB_003a7b60;
  case EHTokMin16int1x3:
  case EHTokMin12int1x3:
    iVar9 = 3;
    goto LAB_003a7b60;
  case EHTokMin16int1x4:
  case EHTokMin12int1x4:
    iVar9 = 4;
LAB_003a7b60:
    mc = 1;
    t = TVar8;
    goto LAB_003a81c1;
  case EHTokMin16int2x1:
  case EHTokMin12int2x1:
    iVar9 = 1;
    t = TVar8;
    break;
  case EHTokMin16int2x2:
  case EHTokMin12int2x2:
    iVar9 = 2;
    t = TVar8;
    break;
  case EHTokMin16int2x3:
  case EHTokMin12int2x3:
    iVar9 = 3;
    t = TVar8;
    break;
  case EHTokMin16int2x4:
  case EHTokMin12int2x4:
    iVar9 = 4;
    t = TVar8;
    break;
  case EHTokMin16int3x1:
  case EHTokMin12int3x1:
    iVar9 = 1;
    goto LAB_003a7ab3;
  case EHTokMin16int3x2:
  case EHTokMin12int3x2:
    iVar9 = 2;
    goto LAB_003a7ab3;
  case EHTokMin16int3x3:
  case EHTokMin12int3x3:
    iVar9 = 3;
    goto LAB_003a7ab3;
  case EHTokMin16int3x4:
  case EHTokMin12int3x4:
    iVar9 = 4;
LAB_003a7ab3:
    mc = 3;
    t = TVar8;
    goto LAB_003a81c1;
  case EHTokMin16int4x1:
  case EHTokMin12int4x1:
    iVar9 = 1;
    goto LAB_003a7b3a;
  case EHTokMin16int4x2:
  case EHTokMin12int4x2:
    iVar9 = 2;
    goto LAB_003a7b3a;
  case EHTokMin16int4x3:
  case EHTokMin12int4x3:
    iVar9 = 3;
    goto LAB_003a7b3a;
  case EHTokMin16int4x4:
  case EHTokMin12int4x4:
    iVar9 = 4;
LAB_003a7b3a:
    mc = 4;
    t = TVar8;
    goto LAB_003a81c1;
  case EHTokMin16uint1x1:
    iVar9 = 1;
    goto LAB_003a81b0;
  case EHTokMin16uint1x2:
    iVar9 = 2;
    goto LAB_003a81b0;
  case EHTokMin16uint1x3:
    iVar9 = 3;
    goto LAB_003a81b0;
  case EHTokMin16uint1x4:
    iVar9 = 4;
LAB_003a81b0:
    mc = 1;
    t = TVar6;
    goto LAB_003a81c1;
  case EHTokMin16uint2x1:
    iVar9 = 1;
    t = TVar6;
    break;
  case EHTokMin16uint2x2:
    iVar9 = 2;
    t = TVar6;
    break;
  case EHTokMin16uint2x3:
    iVar9 = 3;
    t = TVar6;
    break;
  case EHTokMin16uint2x4:
    iVar9 = 4;
    t = TVar6;
    break;
  case EHTokMin16uint3x1:
    iVar9 = 1;
    goto LAB_003a8068;
  case EHTokMin16uint3x2:
    iVar9 = 2;
    goto LAB_003a8068;
  case EHTokMin16uint3x3:
    iVar9 = 3;
    goto LAB_003a8068;
  case EHTokMin16uint3x4:
    iVar9 = 4;
LAB_003a8068:
    mc = 3;
    t = TVar6;
    goto LAB_003a81c1;
  case EHTokMin16uint4x1:
    iVar9 = 1;
    goto LAB_003a8192;
  case EHTokMin16uint4x2:
    iVar9 = 2;
    goto LAB_003a8192;
  case EHTokMin16uint4x3:
    iVar9 = 3;
    goto LAB_003a8192;
  case EHTokMin16uint4x4:
    iVar9 = 4;
LAB_003a8192:
    mc = 4;
    t = TVar6;
    goto LAB_003a81c1;
  case EHTokSampler:
  case EHTokSampler1d:
  case EHTokSampler2d:
  case EHTokSampler3d:
  case EHTokSamplerCube:
    if (((this->parseContext->super_TParseContextBase).super_TParseVersions.messages &
        EShMsgHlslDX9Compatible) != EShMsgDefault) {
      bVar3 = acceptSamplerTypeDX9(this,type);
      return bVar3;
    }
  case EHTokSamplerState:
  case EHTokSamplerComparisonState:
    bVar3 = acceptSamplerType(this,type);
    return bVar3;
  case EHTokTexture:
  case EHTokTypedef:
  case EHTokThis:
  case EHTokNamespace:
    goto switchD_003a7838_caseD_118;
  case EHTokSubpassInput:
  case EHTokSubpassInputMS:
    bVar3 = acceptSubpassInputType(this,type);
    return bVar3;
  case EHTokAppendStructuredBuffer:
  case EHTokByteAddressBuffer:
  case EHTokConsumeStructuredBuffer:
  case EHTokRWByteAddressBuffer:
  case EHTokRWStructuredBuffer:
  case EHTokStructuredBuffer:
    bVar3 = acceptStructBufferType(this,type);
    return bVar3;
  case EHTokTextureBuffer:
    bVar3 = acceptTextureBufferType(this,type);
    return bVar3;
  case EHTokIdentifier:
    pTVar5 = HlslParseContext::lookupUserType
                       (this->parseContext,(this->super_HlslTokenStream).token.field_2.string,type);
    if (pTVar5 == (TSymbol *)0x0) {
      return false;
    }
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    return true;
  case EHTokClass:
  case EHTokStruct:
  case EHTokCBuffer:
  case EHTokTBuffer:
    bVar3 = acceptStruct(this,type,nodeList);
    return bVar3;
  case EHTokConstantBuffer:
    bVar3 = acceptConstantBufferType(this,type);
    goto switchD_003a7838_caseD_118;
  }
  mc = 2;
  vs_00 = 0;
LAB_003a82ad:
  TType::TType(type,t,EvqTemporary,EpqMedium,vs_00,mc,iVar9,false);
LAB_003a8542:
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  bVar3 = true;
  if (((bool)(bVar2 | bVar1)) && (iVar9 = (*type->_vptr_TType[0x26])(type), (char)iVar9 == '\0')) {
    bVar3 = false;
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this->parseContext,&(this->super_HlslTokenStream).token,
               "unorm and snorm only valid in floating point domain","","");
  }
switchD_003a7838_caseD_118:
  return bVar3;
}

Assistant:

bool HlslGrammar::acceptType(TType& type, TIntermNode*& nodeList)
{
    // Basic types for min* types, use native halfs if the option allows them.
    bool enable16BitTypes = parseContext.hlslEnable16BitTypes();

    const TBasicType min16float_bt = enable16BitTypes ? EbtFloat16 : EbtFloat;
    const TBasicType min10float_bt = enable16BitTypes ? EbtFloat16 : EbtFloat;
    const TBasicType half_bt       = enable16BitTypes ? EbtFloat16 : EbtFloat;
    const TBasicType min16int_bt   = enable16BitTypes ? EbtInt16   : EbtInt;
    const TBasicType min12int_bt   = enable16BitTypes ? EbtInt16   : EbtInt;
    const TBasicType min16uint_bt  = enable16BitTypes ? EbtUint16  : EbtUint;

    // Some types might have turned into identifiers. Take the hit for checking
    // when this has happened.
    if (typeIdentifiers) {
        const char* identifierString = getTypeString(peek());
        if (identifierString != nullptr) {
            TString name = identifierString;
            // if it's an identifier, it's not a type
            if (parseContext.symbolTable.find(name) != nullptr)
                return false;
        }
    }

    bool isUnorm = false;
    bool isSnorm = false;

    // Accept snorm and unorm.  Presently, this is ignored, save for an error check below.
    switch (peek()) {
    case EHTokUnorm:
        isUnorm = true;
        advanceToken();  // eat the token
        break;
    case EHTokSNorm:
        isSnorm = true;
        advanceToken();  // eat the token
        break;
    default:
        break;
    }

    switch (peek()) {
    case EHTokVector:
        return acceptVectorTemplateType(type);
        break;

    case EHTokMatrix:
        return acceptMatrixTemplateType(type);
        break;

    case EHTokPointStream:            // fall through
    case EHTokLineStream:             // ...
    case EHTokTriangleStream:         // ...
        {
            TLayoutGeometry geometry;
            if (! acceptStreamOutTemplateType(type, geometry))
                return false;

            if (! parseContext.handleOutputGeometry(token.loc, geometry))
                return false;

            return true;
        }

    case EHTokInputPatch:             // fall through
    case EHTokOutputPatch:            // ...
        {
            if (! acceptTessellationPatchTemplateType(type))
                return false;

            return true;
        }

    case EHTokSampler:                // fall through
    case EHTokSampler1d:              // ...
    case EHTokSampler2d:              // ...
    case EHTokSampler3d:              // ...
    case EHTokSamplerCube:            // ...
        if (parseContext.hlslDX9Compatible())
            return acceptSamplerTypeDX9(type);
        else
            return acceptSamplerType(type);
        break;

    case EHTokSamplerState:           // fall through
    case EHTokSamplerComparisonState: // ...
        return acceptSamplerType(type);
        break;

    case EHTokSubpassInput:           // fall through
    case EHTokSubpassInputMS:         // ...
        return acceptSubpassInputType(type);
        break;

    case EHTokBuffer:                 // fall through
    case EHTokTexture1d:              // ...
    case EHTokTexture1darray:         // ...
    case EHTokTexture2d:              // ...
    case EHTokTexture2darray:         // ...
    case EHTokTexture3d:              // ...
    case EHTokTextureCube:            // ...
    case EHTokTextureCubearray:       // ...
    case EHTokTexture2DMS:            // ...
    case EHTokTexture2DMSarray:       // ...
    case EHTokRWTexture1d:            // ...
    case EHTokRWTexture1darray:       // ...
    case EHTokRWTexture2d:            // ...
    case EHTokRWTexture2darray:       // ...
    case EHTokRWTexture3d:            // ...
    case EHTokRWBuffer:               // ...
        return acceptTextureType(type);
        break;

    case EHTokAppendStructuredBuffer:
    case EHTokByteAddressBuffer:
    case EHTokConsumeStructuredBuffer:
    case EHTokRWByteAddressBuffer:
    case EHTokRWStructuredBuffer:
    case EHTokStructuredBuffer:
        return acceptStructBufferType(type);
        break;

    case EHTokTextureBuffer:
        return acceptTextureBufferType(type);
        break;

    case EHTokConstantBuffer:
        return acceptConstantBufferType(type);

    case EHTokClass:
    case EHTokStruct:
    case EHTokCBuffer:
    case EHTokTBuffer:
        return acceptStruct(type, nodeList);

    case EHTokIdentifier:
        // An identifier could be for a user-defined type.
        // Note we cache the symbol table lookup, to save for a later rule
        // when this is not a type.
        if (parseContext.lookupUserType(*token.string, type) != nullptr) {
            advanceToken();
            return true;
        } else
            return false;

    case EHTokVoid:
        new(&type) TType(EbtVoid);
        break;

    case EHTokString:
        new(&type) TType(EbtString);
        break;

    case EHTokFloat:
        new(&type) TType(EbtFloat);
        break;
    case EHTokFloat1:
        new(&type) TType(EbtFloat);
        type.makeVector();
        break;
    case EHTokFloat2:
        new(&type) TType(EbtFloat, EvqTemporary, 2);
        break;
    case EHTokFloat3:
        new(&type) TType(EbtFloat, EvqTemporary, 3);
        break;
    case EHTokFloat4:
        new(&type) TType(EbtFloat, EvqTemporary, 4);
        break;

    case EHTokDouble:
        new(&type) TType(EbtDouble);
        break;
    case EHTokDouble1:
        new(&type) TType(EbtDouble);
        type.makeVector();
        break;
    case EHTokDouble2:
        new(&type) TType(EbtDouble, EvqTemporary, 2);
        break;
    case EHTokDouble3:
        new(&type) TType(EbtDouble, EvqTemporary, 3);
        break;
    case EHTokDouble4:
        new(&type) TType(EbtDouble, EvqTemporary, 4);
        break;

    case EHTokInt:
    case EHTokDword:
        new(&type) TType(EbtInt);
        break;
    case EHTokInt1:
        new(&type) TType(EbtInt);
        type.makeVector();
        break;
    case EHTokInt2:
        new(&type) TType(EbtInt, EvqTemporary, 2);
        break;
    case EHTokInt3:
        new(&type) TType(EbtInt, EvqTemporary, 3);
        break;
    case EHTokInt4:
        new(&type) TType(EbtInt, EvqTemporary, 4);
        break;

    case EHTokUint:
        new(&type) TType(EbtUint);
        break;
    case EHTokUint1:
        new(&type) TType(EbtUint);
        type.makeVector();
        break;
    case EHTokUint2:
        new(&type) TType(EbtUint, EvqTemporary, 2);
        break;
    case EHTokUint3:
        new(&type) TType(EbtUint, EvqTemporary, 3);
        break;
    case EHTokUint4:
        new(&type) TType(EbtUint, EvqTemporary, 4);
        break;

    case EHTokUint64:
        new(&type) TType(EbtUint64);
        break;

    case EHTokBool:
        new(&type) TType(EbtBool);
        break;
    case EHTokBool1:
        new(&type) TType(EbtBool);
        type.makeVector();
        break;
    case EHTokBool2:
        new(&type) TType(EbtBool, EvqTemporary, 2);
        break;
    case EHTokBool3:
        new(&type) TType(EbtBool, EvqTemporary, 3);
        break;
    case EHTokBool4:
        new(&type) TType(EbtBool, EvqTemporary, 4);
        break;

    case EHTokHalf:
        new(&type) TType(half_bt, EvqTemporary);
        break;
    case EHTokHalf1:
        new(&type) TType(half_bt, EvqTemporary);
        type.makeVector();
        break;
    case EHTokHalf2:
        new(&type) TType(half_bt, EvqTemporary, 2);
        break;
    case EHTokHalf3:
        new(&type) TType(half_bt, EvqTemporary, 3);
        break;
    case EHTokHalf4:
        new(&type) TType(half_bt, EvqTemporary, 4);
        break;

    case EHTokMin16float:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin16float1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin16float2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin16float3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin16float4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin10float:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin10float1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin10float2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin10float3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin10float4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin16int:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin16int1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin16int2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin16int3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin16int4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin12int:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin12int1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin12int2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin12int3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin12int4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokMin16uint:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium);
        break;
    case EHTokMin16uint1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium);
        type.makeVector();
        break;
    case EHTokMin16uint2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 2);
        break;
    case EHTokMin16uint3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 3);
        break;
    case EHTokMin16uint4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 4);
        break;

    case EHTokInt1x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 1);
        break;
    case EHTokInt1x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 2);
        break;
    case EHTokInt1x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 3);
        break;
    case EHTokInt1x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 1, 4);
        break;
    case EHTokInt2x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 1);
        break;
    case EHTokInt2x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 2);
        break;
    case EHTokInt2x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 3);
        break;
    case EHTokInt2x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 2, 4);
        break;
    case EHTokInt3x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 1);
        break;
    case EHTokInt3x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 2);
        break;
    case EHTokInt3x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 3);
        break;
    case EHTokInt3x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 3, 4);
        break;
    case EHTokInt4x1:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 1);
        break;
    case EHTokInt4x2:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 2);
        break;
    case EHTokInt4x3:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 3);
        break;
    case EHTokInt4x4:
        new(&type) TType(EbtInt, EvqTemporary, 0, 4, 4);
        break;

    case EHTokUint1x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 1);
        break;
    case EHTokUint1x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 2);
        break;
    case EHTokUint1x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 3);
        break;
    case EHTokUint1x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 1, 4);
        break;
    case EHTokUint2x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 1);
        break;
    case EHTokUint2x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 2);
        break;
    case EHTokUint2x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 3);
        break;
    case EHTokUint2x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 2, 4);
        break;
    case EHTokUint3x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 1);
        break;
    case EHTokUint3x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 2);
        break;
    case EHTokUint3x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 3);
        break;
    case EHTokUint3x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 3, 4);
        break;
    case EHTokUint4x1:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 1);
        break;
    case EHTokUint4x2:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 2);
        break;
    case EHTokUint4x3:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 3);
        break;
    case EHTokUint4x4:
        new(&type) TType(EbtUint, EvqTemporary, 0, 4, 4);
        break;

    case EHTokBool1x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 1);
        break;
    case EHTokBool1x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 2);
        break;
    case EHTokBool1x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 3);
        break;
    case EHTokBool1x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 1, 4);
        break;
    case EHTokBool2x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 1);
        break;
    case EHTokBool2x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 2);
        break;
    case EHTokBool2x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 3);
        break;
    case EHTokBool2x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 2, 4);
        break;
    case EHTokBool3x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 1);
        break;
    case EHTokBool3x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 2);
        break;
    case EHTokBool3x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 3);
        break;
    case EHTokBool3x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 3, 4);
        break;
    case EHTokBool4x1:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 1);
        break;
    case EHTokBool4x2:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 2);
        break;
    case EHTokBool4x3:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 3);
        break;
    case EHTokBool4x4:
        new(&type) TType(EbtBool, EvqTemporary, 0, 4, 4);
        break;

    case EHTokFloat1x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 1);
        break;
    case EHTokFloat1x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 2);
        break;
    case EHTokFloat1x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 3);
        break;
    case EHTokFloat1x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 1, 4);
        break;
    case EHTokFloat2x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 1);
        break;
    case EHTokFloat2x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 2);
        break;
    case EHTokFloat2x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 3);
        break;
    case EHTokFloat2x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 2, 4);
        break;
    case EHTokFloat3x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 1);
        break;
    case EHTokFloat3x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 2);
        break;
    case EHTokFloat3x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 3);
        break;
    case EHTokFloat3x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 3, 4);
        break;
    case EHTokFloat4x1:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 1);
        break;
    case EHTokFloat4x2:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 2);
        break;
    case EHTokFloat4x3:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 3);
        break;
    case EHTokFloat4x4:
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 4);
        break;

    case EHTokHalf1x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 1);
        break;
    case EHTokHalf1x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 2);
        break;
    case EHTokHalf1x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 3);
        break;
    case EHTokHalf1x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 1, 4);
        break;
    case EHTokHalf2x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 1);
        break;
    case EHTokHalf2x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 2);
        break;
    case EHTokHalf2x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 3);
        break;
    case EHTokHalf2x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 2, 4);
        break;
    case EHTokHalf3x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 1);
        break;
    case EHTokHalf3x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 2);
        break;
    case EHTokHalf3x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 3);
        break;
    case EHTokHalf3x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 3, 4);
        break;
    case EHTokHalf4x1:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 1);
        break;
    case EHTokHalf4x2:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 2);
        break;
    case EHTokHalf4x3:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 3);
        break;
    case EHTokHalf4x4:
        new(&type) TType(half_bt, EvqTemporary, 0, 4, 4);
        break;

    case EHTokDouble1x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 1);
        break;
    case EHTokDouble1x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 2);
        break;
    case EHTokDouble1x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 3);
        break;
    case EHTokDouble1x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 1, 4);
        break;
    case EHTokDouble2x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 1);
        break;
    case EHTokDouble2x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 2);
        break;
    case EHTokDouble2x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 3);
        break;
    case EHTokDouble2x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 2, 4);
        break;
    case EHTokDouble3x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 1);
        break;
    case EHTokDouble3x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 2);
        break;
    case EHTokDouble3x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 3);
        break;
    case EHTokDouble3x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 3, 4);
        break;
    case EHTokDouble4x1:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 1);
        break;
    case EHTokDouble4x2:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 2);
        break;
    case EHTokDouble4x3:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 3);
        break;
    case EHTokDouble4x4:
        new(&type) TType(EbtDouble, EvqTemporary, 0, 4, 4);
        break;

    case EHTokMin16float1x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin16float1x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin16float1x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin16float1x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin16float2x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin16float2x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin16float2x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin16float2x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin16float3x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin16float3x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin16float3x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin16float3x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin16float4x1:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin16float4x2:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin16float4x3:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin16float4x4:
        new(&type) TType(min16float_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin10float1x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin10float1x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin10float1x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin10float1x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin10float2x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin10float2x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin10float2x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin10float2x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin10float3x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin10float3x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin10float3x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin10float3x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin10float4x1:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin10float4x2:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin10float4x3:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin10float4x4:
        new(&type) TType(min10float_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin16int1x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin16int1x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin16int1x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin16int1x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin16int2x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin16int2x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin16int2x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin16int2x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin16int3x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin16int3x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin16int3x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin16int3x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin16int4x1:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin16int4x2:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin16int4x3:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin16int4x4:
        new(&type) TType(min16int_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin12int1x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin12int1x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin12int1x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin12int1x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin12int2x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin12int2x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin12int2x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin12int2x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin12int3x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin12int3x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin12int3x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin12int3x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin12int4x1:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin12int4x2:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin12int4x3:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin12int4x4:
        new(&type) TType(min12int_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    case EHTokMin16uint1x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 1);
        break;
    case EHTokMin16uint1x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 2);
        break;
    case EHTokMin16uint1x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 3);
        break;
    case EHTokMin16uint1x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 1, 4);
        break;
    case EHTokMin16uint2x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 1);
        break;
    case EHTokMin16uint2x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 2);
        break;
    case EHTokMin16uint2x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 3);
        break;
    case EHTokMin16uint2x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 2, 4);
        break;
    case EHTokMin16uint3x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 1);
        break;
    case EHTokMin16uint3x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 2);
        break;
    case EHTokMin16uint3x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 3);
        break;
    case EHTokMin16uint3x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 3, 4);
        break;
    case EHTokMin16uint4x1:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 1);
        break;
    case EHTokMin16uint4x2:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 2);
        break;
    case EHTokMin16uint4x3:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 3);
        break;
    case EHTokMin16uint4x4:
        new(&type) TType(min16uint_bt, EvqTemporary, EpqMedium, 0, 4, 4);
        break;

    default:
        return false;
    }

    advanceToken();

    if ((isUnorm || isSnorm) && !type.isFloatingDomain()) {
        parseContext.error(token.loc, "unorm and snorm only valid in floating point domain", "", "");
        return false;
    }

    return true;
}